

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool __thiscall tinyxml2::XMLElement::ShallowEqual(XMLElement *this,XMLNode *compare)

{
  XMLDocument *pXVar1;
  XMLAttribute *pXVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  XMLAttribute **ppXVar7;
  XMLDocument **ppXVar8;
  XMLNode *this_00;
  
  iVar4 = (*compare->_vptr_XMLNode[6])(compare);
  this_00 = (XMLNode *)CONCAT44(extraout_var,iVar4);
  if (this_00 != (XMLNode *)0x0) {
    pcVar5 = XMLNode::Value(this_00);
    pcVar6 = XMLNode::Value(&this->super_XMLNode);
    bVar3 = XMLUtil::StringEqual(pcVar5,pcVar6,0x7fffffff);
    if (bVar3) {
      ppXVar7 = &this->_rootAttribute;
      ppXVar8 = &this_00[1]._document;
      while( true ) {
        pXVar1 = *ppXVar8;
        pXVar2 = *ppXVar7;
        if ((pXVar1 == (XMLDocument *)0x0) || (pXVar2 == (XMLAttribute *)0x0)) {
          return pXVar1 == (XMLDocument *)0x0 && pXVar2 == (XMLAttribute *)0x0;
        }
        pcVar5 = StrPair::GetStr(&pXVar2->_value);
        pcVar6 = StrPair::GetStr((StrPair *)&(pXVar1->super_XMLNode)._value._start);
        bVar3 = XMLUtil::StringEqual(pcVar5,pcVar6,0x7fffffff);
        if (!bVar3) break;
        ppXVar7 = &pXVar2->_next;
        ppXVar8 = (XMLDocument **)&(pXVar1->super_XMLNode)._lastChild;
      }
    }
  }
  return false;
}

Assistant:

bool XMLElement::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLElement* other = compare->ToElement();
    if ( other && XMLUtil::StringEqual( other->Name(), Name() )) {

        const XMLAttribute* a=FirstAttribute();
        const XMLAttribute* b=other->FirstAttribute();

        while ( a && b ) {
            if ( !XMLUtil::StringEqual( a->Value(), b->Value() ) ) {
                return false;
            }
            a = a->Next();
            b = b->Next();
        }
        if ( a || b ) {
            // different count
            return false;
        }
        return true;
    }
    return false;
}